

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateFastCmTypeOf
          (Lowerer *this,Instr *compare,RegOpnd *object,IntConstOpnd *typeIdOpnd,Instr *typeOf,
          bool *pfNoLower,bool isNeqOp)

{
  TypeId typeIdToCheck;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint32 offset;
  BailOutKind BVar6;
  LabelInstr *done;
  LabelInstr *target;
  LabelInstr *pLVar7;
  undefined4 *puVar8;
  RegOpnd *typeOpnd;
  Lowerer *pLVar9;
  undefined4 extraout_var;
  AddrOpnd *pAVar10;
  LabelInstr *pLVar11;
  IndirOpnd *pIVar12;
  Lowerer *dst;
  undefined4 extraout_var_00;
  IntConstOpnd *pIVar13;
  BailOutInfo *bailoutInfo;
  Opnd *this_00;
  undefined4 extraout_var_01;
  OpCode branchOpCode;
  LabelInstr *labelTarget;
  Instr *local_68;
  
  uVar4 = compare->m_opcode - 0x3b;
  if ((7 < uVar4) || ((0xe1U >> (uVar4 & 0x1f) & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x62fc,
                       "(compare->m_opcode == Js::OpCode::CmSrEq_A || compare->m_opcode == Js::OpCode::CmEq_A || compare->m_opcode == Js::OpCode::CmSrNeq_A || compare->m_opcode == Js::OpCode::CmNeq_A)"
                       ,
                       "compare->m_opcode == Js::OpCode::CmSrEq_A || compare->m_opcode == Js::OpCode::CmEq_A || compare->m_opcode == Js::OpCode::CmSrNeq_A || compare->m_opcode == Js::OpCode::CmNeq_A"
                      );
    if (!bVar3) goto LAB_005e9219;
    *puVar8 = 0;
  }
  typeIdToCheck = (TypeId)(typeIdOpnd->super_EncodableOpnd<long>).m_value;
  done = IR::LabelInstr::New(Label,this->m_func,false);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  pLVar7 = IR::LabelInstr::New(Label,this->m_func,true);
  OVar2 = IR::Opnd::GetKind(compare->m_dst);
  if (OVar2 == OpndKindReg) {
    this_00 = compare->m_dst;
    OVar2 = IR::Opnd::GetKind(this_00);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005e9219;
      *puVar8 = 0;
    }
    typeOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  }
  else {
    typeOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6305,"(dst)","dst");
    if (!bVar3) goto LAB_005e9219;
    *puVar8 = 0;
    this_00 = (Opnd *)0x0;
  }
  bVar3 = IR::Opnd::IsEqual(this_00,&object->super_Opnd);
  if (bVar3) {
    pLVar9 = (Lowerer *)IR::RegOpnd::New((object->super_Opnd).m_type,this->m_func);
    InsertMove((Opnd *)pLVar9,&object->super_Opnd,compare,true);
    object = (RegOpnd *)pLVar9;
  }
  iVar5 = (*compare->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
  pAVar10 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar5),AddrOpndKindDynamicVar,compare->m_func,
                              true,(Var)0x0);
  InsertMove(this_00,&pAVar10->super_Opnd,compare,true);
  pLVar11 = done;
  if (typeIdToCheck == TypeIds_Number) {
    pLVar11 = target;
  }
  labelTarget = target;
  if (pLVar11 == target) {
    labelTarget = done;
  }
  if (!isNeqOp) {
    labelTarget = pLVar11;
  }
  LowererMD::GenerateObjectTest(&this->m_lowererMD,&object->super_Opnd,compare,labelTarget,false);
  pIVar12 = IR::IndirOpnd::New(object,8,TyInt64,this->m_func,false);
  InsertMove(&typeOpnd->super_Opnd,&pIVar12->super_Opnd,compare,true);
  GenerateFalsyObjectTest(this,compare,typeOpnd,typeIdToCheck,target,done,isNeqOp);
  dst = (Lowerer *)IR::RegOpnd::New(TyInt32,this->m_func);
  offset = Js::Type::GetOffsetOfTypeId();
  pIVar12 = IR::IndirOpnd::New(typeOpnd,offset,TyInt32,this->m_func,false);
  pLVar9 = dst;
  InsertMove((Opnd *)dst,&pIVar12->super_Opnd,compare,true);
  pLVar11 = done;
  if (typeIdToCheck == TypeIds_Function) {
    object = (RegOpnd *)dst;
    if (!isNeqOp) {
      pLVar11 = target;
    }
  }
  else {
    if (typeIdToCheck != TypeIds_Object) {
      if (typeIdToCheck == TypeIds_Number) {
        pLVar9 = (Lowerer *)&DAT_00000006;
        pIVar13 = IR::IntConstOpnd::New(6,TyInt32,compare->m_func,false);
        pLVar7 = target;
        if (!isNeqOp) {
          pLVar7 = done;
        }
        InsertCompareBranch(pLVar9,(Opnd *)dst,&pIVar13->super_Opnd,BrGt_A,false,pLVar7,compare,
                            false);
        pLVar9 = (Lowerer *)&DAT_00000003;
        typeIdOpnd = IR::IntConstOpnd::New(3,TyInt32,compare->m_func,false);
        branchOpCode = (ushort)isNeqOp * 2 + BrGe_A;
      }
      else {
        branchOpCode = isNeqOp | BrEq_A;
      }
      InsertCompareBranch(pLVar9,(Opnd *)dst,&typeIdOpnd->super_Opnd,branchOpCode,false,target,
                          compare,false);
      IR::Instr::InsertAfter(compare,&target->super_Instr);
      IR::Instr::Remove(typeOf);
      this_00 = IR::Instr::UnlinkDst(compare);
      OVar2 = IR::Opnd::GetKind(this_00);
      if (OVar2 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) {
LAB_005e9219:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar8 = 0;
      }
      IR::Instr::Remove(compare);
      *pfNoLower = true;
      goto LAB_005e91c4;
    }
    if (!isNeqOp) {
      pLVar11 = target;
    }
    InsertCompareBranch(pLVar9,(Opnd *)dst,&typeIdOpnd->super_Opnd,BrGe_A,false,pLVar11,compare,
                        false);
    iVar5 = (**compare->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo)();
    pLVar9 = (Lowerer *)CONCAT44(extraout_var_00,iVar5);
    typeIdOpnd = (IntConstOpnd *)
                 IR::AddrOpnd::New((intptr_t)pLVar9,AddrOpndKindDynamicVar,compare->m_func,true,
                                   (Var)0x0);
  }
  InsertCompareBranch(pLVar9,&object->super_Opnd,&typeIdOpnd->super_Opnd,BrEq_A,false,pLVar11,
                      compare,false);
  IR::Instr::InsertAfter(compare,&target->super_Instr);
  pLVar9 = (Lowerer *)0x1a;
  pIVar13 = IR::IntConstOpnd::New(0x1a,TyInt32,this->m_func,false);
  InsertCompareBranch(pLVar9,(Opnd *)dst,&pIVar13->super_Opnd,BrEq_A,false,pLVar7,compare,false);
  pLVar9 = (Lowerer *)0x17;
  pIVar13 = IR::IntConstOpnd::New(0x17,TyInt32,this->m_func,false);
  pLVar11 = target;
  if (!isNeqOp) {
    pLVar11 = done;
  }
  InsertCompareBranch(pLVar9,(Opnd *)dst,&pIVar13->super_Opnd,BrNeq_A,false,pLVar11,compare,false);
  IR::Instr::InsertBefore(compare,&pLVar7->super_Instr);
  IR::Instr::Unlink(typeOf);
  IR::Instr::InsertBefore(compare,typeOf);
  local_68 = typeOf;
  if ((((compare->field_0x38 & 0x10) != 0) &&
      (BVar6 = IR::Instr::GetBailOutKind(compare),
      (BVar6 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls)) &&
     (((typeOf->field_0x38 & 0x10) == 0 ||
      (BVar6 = IR::Instr::GetBailOutKind(typeOf),
      (BVar6 & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls)))) {
    bailoutInfo = IR::Instr::GetBailOutInfo(compare);
    BVar6 = IR::Instr::GetBailOutKind(compare);
    local_68 = AddBailoutToHelperCallInstr(this,typeOf,bailoutInfo,BVar6,compare);
  }
  LoadScriptContext(this,local_68);
  LowerUnaryHelper(this,local_68,HelperOp_Typeof,(Opnd *)0x0);
  InsertBranch(Br,false,target,&target->super_Instr);
LAB_005e91c4:
  IR::Instr::InsertBefore(&target->super_Instr,&done->super_Instr);
  iVar5 = (*((target->super_Instr).m_func)->m_scriptContextInfo->_vptr_ScriptContextInfo[3])();
  pAVar10 = IR::AddrOpnd::New(CONCAT44(extraout_var_01,iVar5),AddrOpndKindDynamicVar,
                              (target->super_Instr).m_func,true,(Var)0x0);
  InsertMove(this_00,&pAVar10->super_Opnd,&target->super_Instr,true);
  return;
}

Assistant:

void
Lowerer::GenerateFastCmTypeOf(IR::Instr *compare, IR::RegOpnd *object, IR::IntConstOpnd *typeIdOpnd, IR::Instr *typeOf, bool *pfNoLower, bool isNeqOp)
{
    Assert(compare->m_opcode == Js::OpCode::CmSrEq_A  ||
           compare->m_opcode == Js::OpCode::CmEq_A    ||
           compare->m_opcode == Js::OpCode::CmSrNeq_A ||
           compare->m_opcode == Js::OpCode::CmNeq_A);

    Js::TypeId      typeId   = static_cast<Js::TypeId>(typeIdOpnd->GetValue());
    IR::LabelInstr *movFalse = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
    IR::LabelInstr *done = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
    IR::LabelInstr *helper= IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::RegOpnd    *dst      = compare->GetDst()->IsRegOpnd() ? compare->GetDst()->AsRegOpnd() : nullptr;
    IR::RegOpnd    *typeRegOpnd  = IR::RegOpnd::New(TyMachReg, m_func);

    Assert(dst);

    if (dst->IsEqual(object))
    {
        //dst same as the src of typeof. As we need to move true to dst first we need to save the src to a new opnd
        IR::RegOpnd *newObject = IR::RegOpnd::New(object->GetType(), m_func);
        InsertMove(newObject, object, compare); //Save src
        object = newObject;
    }

    // mov dst, 'true'
    InsertMove(dst,
               LoadLibraryValueOpnd(compare, LibraryValue::ValueTrue),
               compare);

    // TEST object, 1
    // JNE (typeId == Js::TypeIds_Number) ? $done : $movFalse
    IR::LabelInstr *target = (typeId == Js::TypeIds_Number) ? done : movFalse;
    if (isNeqOp)
    {
        target = (target == done) ? movFalse : done;
    }

    m_lowererMD.GenerateObjectTest(object, compare, target);

    // MOV typeRegOpnd, [object + offset(Type)]
    InsertMove(typeRegOpnd,
               IR::IndirOpnd::New(object, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func),
               compare);

    GenerateFalsyObjectTest(compare, typeRegOpnd, typeId, done, movFalse, isNeqOp);

    // MOV objTypeId, [typeRegOpnd + offset(TypeId)]
    IR::RegOpnd* objTypeIdOpnd = IR::RegOpnd::New(TyInt32, m_func);
    InsertMove(objTypeIdOpnd,
               IR::IndirOpnd::New(typeRegOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, m_func),
               compare);

    // CMP objTypeId, typeId
    // JEQ/JGE $done
    if (typeId == Js::TypeIds_Object)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrGe_A, isNeqOp ? movFalse : done, compare);
    }
    else if (typeId == Js::TypeIds_Function)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrEq_A, isNeqOp ? movFalse : done, compare);
    }
    else if (typeId == Js::TypeIds_Number)
    {
        //Check for the typeIds between  TypeIds_FirstNumberType <= typeIds <= TypeIds_LastNumberType
        InsertCompareBranch(objTypeIdOpnd,
                                IR::IntConstOpnd::New(Js::TypeIds_LastNumberType, TyInt32, compare->m_func),
                                Js::OpCode::BrGt_A,
                                isNeqOp ? done : movFalse,
                                compare);

        InsertCompareBranch(objTypeIdOpnd,
                                IR::IntConstOpnd::New(Js::TypeIds_FirstNumberType, TyInt32, compare->m_func),
                                isNeqOp? Js::OpCode::BrLt_A : Js::OpCode::BrGe_A,
                                done,
                                compare);
    }
    else
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, done, compare);
    }

    // This could be 'null' which, for historical reasons, has a TypeId < TypeIds_Object but
    // is still a Javascript "object."
    if (typeId == Js::TypeIds_Object)
    {
        // CMP object, 0xXXXXXXXX
        // JEQ isNeqOp ? $movFalse : $done
        InsertCompareBranch(object,
                            LoadLibraryValueOpnd(compare, LibraryValue::ValueNull),
                            Js::OpCode::BrEq_A,
                            isNeqOp ? movFalse : done,
                            compare);
    }

    compare->InsertAfter(done); // Get this label first

    // "object" or "function" may come from HostDispatch. Needs helper if that's the case.
    if (typeId == Js::TypeIds_Object || typeId == Js::TypeIds_Function)
    {
        // CMP objTypeId, TypeIds_Proxy
        // JNE isNeqOp ? $done : $movFalse
        InsertCompareBranch(objTypeIdOpnd,
            IR::IntConstOpnd::New(Js::TypeIds_Proxy, TyInt32, m_func),
            Js::OpCode::BrEq_A,
            helper,
            compare);

        // CMP objTypeId, TypeIds_HostDispatch
        // JNE isNeqOp ? $done : $movFalse
        InsertCompareBranch(objTypeIdOpnd,
                            IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, m_func),
                            Js::OpCode::BrNeq_A,
                            isNeqOp ? done : movFalse,
                            compare);

        // Now emit Typeof like we would've for the helper call.
        {
            compare->InsertBefore(helper);
            typeOf->Unlink();
            compare->InsertBefore(typeOf);
            if (compare->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(compare->GetBailOutKind()) &&
                (!typeOf->HasBailOutInfo() || !BailOutInfo::IsBailOutOnImplicitCalls(typeOf->GetBailOutKind())))
            {
                typeOf = AddBailoutToHelperCallInstr(typeOf, compare->GetBailOutInfo(), compare->GetBailOutKind(), compare);
            }
            LowerUnaryHelperMem(typeOf, IR::HelperOp_Typeof);
        }

        // JMP/B $done
        InsertBranch(Js::OpCode::Br, done, done);
    }
    else // Other primitive types don't need helper
    {
        typeOf->Remove();
        dst = compare->UnlinkDst()->AsRegOpnd();
        compare->Remove();
        *pfNoLower = true;
    }

    // $movFalse: (insert before $done)
    done->InsertBefore(movFalse);

    // MOV dst, 'false'
    InsertMove(dst, LoadLibraryValueOpnd(done, LibraryValue::ValueFalse), done);

    // $done:
}